

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_container_to_uint32_array_vector16
              (void *vout,uint16_t *array,size_t cardinality,uint32_t base)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  uint32_t *out;
  int *piVar3;
  long lVar4;
  undefined1 auVar5 [32];
  
  auVar5._4_4_ = base;
  auVar5._0_4_ = base;
  auVar5._8_4_ = base;
  auVar5._12_4_ = base;
  auVar5._16_4_ = base;
  auVar5._20_4_ = base;
  auVar5._24_4_ = base;
  auVar5._28_4_ = base;
  lVar4 = 0;
  uVar2 = 0;
  while (uVar2 + 8 <= cardinality) {
    auVar1 = vpmovzxwd_avx2(*(undefined1 (*) [16])(array + uVar2));
    auVar1 = vpaddd_avx2(auVar5,auVar1);
    *(undefined1 (*) [32])((long)vout + (lVar4 >> 0x1e)) = auVar1;
    lVar4 = lVar4 + 0x800000000;
    uVar2 = uVar2 + 8;
  }
  piVar3 = (int *)((long)vout + (long)(int)uVar2 * 4);
  for (; uVar2 < cardinality; uVar2 = uVar2 + 1) {
    *piVar3 = array[uVar2] + base;
    piVar3 = piVar3 + 1;
  }
  return (int)uVar2;
}

Assistant:

ALLOW_UNALIGNED
int array_container_to_uint32_array_vector16(void *vout, const uint16_t *array,
                                             size_t cardinality,
                                             uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i + sizeof(__m128i) / sizeof(uint16_t) <= cardinality;
         i += sizeof(__m128i) / sizeof(uint16_t)) {
        __m128i vinput = _mm_loadu_si128((const __m128i *)(array + i));
        __m256i voutput = _mm256_add_epi32(_mm256_cvtepu16_epi32(vinput),
                                           _mm256_set1_epi32(base));
        _mm256_storeu_si256((__m256i *)(out + outpos), voutput);
        outpos += sizeof(__m256i) / sizeof(uint32_t);
    }
    for (; i < cardinality; ++i) {
        const uint32_t val = base + array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}